

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qrawfont.cpp
# Opt level: O3

QRawFont __thiscall QRawFont::fromFont(QRawFont *this,QFont *font,WritingSystem writingSystem)

{
  QAtomicInt *pQVar1;
  QFontPrivate *this_00;
  QRawFontPrivate *pQVar2;
  int script;
  HintingPreference HVar3;
  QFontEngine *pQVar4;
  long lVar5;
  undefined8 *puVar6;
  QFontDef *pQVar7;
  QFontEngine *pQVar8;
  QFontEngineMulti *multiEngine;
  long in_FS_OFFSET;
  byte bVar9;
  QFontDef request;
  QFontDef local_a0;
  long local_38;
  
  bVar9 = 0;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  (this->d).d.ptr = (QRawFontPrivate *)&DAT_aaaaaaaaaaaaaaaa;
  QRawFont(this);
  this_00 = (font->d).d.ptr;
  script = qt_script_for_writing_system(writingSystem);
  pQVar4 = QFontPrivate::engineForScript(this_00,script);
  if (pQVar4 != (QFontEngine *)0x0) {
    pQVar8 = pQVar4;
    if (pQVar4->m_type == Multi) {
      pQVar8 = (QFontEngine *)**(undefined8 **)&pQVar4[1].m_type;
      if (3 < script) {
        puVar6 = &DAT_006aa6b8;
        pQVar7 = &local_a0;
        for (lVar5 = 0xd; lVar5 != 0; lVar5 = lVar5 + -1) {
          (pQVar7->families).d.d = (Data *)*puVar6;
          puVar6 = puVar6 + (ulong)bVar9 * -2 + 1;
          pQVar7 = (QFontDef *)((long)pQVar7 + ((ulong)bVar9 * -2 + 1) * 8);
        }
        local_a0.families.d.d = (pQVar4->fontDef).families.d.d;
        local_a0.families.d.ptr = (pQVar4->fontDef).families.d.ptr;
        local_a0.families.d.size = (pQVar4->fontDef).families.d.size;
        if (local_a0.families.d.d != (Data *)0x0) {
          LOCK();
          ((local_a0.families.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_a0.families.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
               _M_i + 1;
          UNLOCK();
        }
        local_a0.styleName.d.d = (pQVar4->fontDef).styleName.d.d;
        local_a0.styleName.d.ptr = (pQVar4->fontDef).styleName.d.ptr;
        local_a0.styleName.d.size = (pQVar4->fontDef).styleName.d.size;
        if (&(local_a0.styleName.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          (((QArrayData *)&((local_a0.styleName.d.d)->super_QArrayData).ref_)->ref_)._q_value.
          super___atomic_base<int>._M_i =
               (((QArrayData *)&((local_a0.styleName.d.d)->super_QArrayData).ref_)->ref_)._q_value.
               super___atomic_base<int>._M_i + 1;
          UNLOCK();
        }
        local_a0.fallBackFamilies.d.d = (pQVar4->fontDef).fallBackFamilies.d.d;
        local_a0.fallBackFamilies.d.ptr = (pQVar4->fontDef).fallBackFamilies.d.ptr;
        local_a0.fallBackFamilies.d.size = (pQVar4->fontDef).fallBackFamilies.d.size;
        if (local_a0.fallBackFamilies.d.d != (Data *)0x0) {
          LOCK();
          ((local_a0.fallBackFamilies.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>
          ._M_i = ((local_a0.fallBackFamilies.d.d)->super_QArrayData).ref_._q_value.
                  super___atomic_base<int>._M_i + 1;
          UNLOCK();
        }
        local_a0.variableAxisValues.d.d.ptr =
             (QExplicitlySharedDataPointerV2<QMapData<std::map<QFont::Tag,_float,_std::less<QFont::Tag>,_std::allocator<std::pair<const_QFont::Tag,_float>_>_>_>_>
              )(pQVar4->fontDef).variableAxisValues.d.d.ptr;
        if (local_a0.variableAxisValues.d.d.ptr !=
            (totally_ordered_wrapper<QMapData<std::map<QFont::Tag,_float,_std::less<QFont::Tag>,_std::allocator<std::pair<const_QFont::Tag,_float>_>_>_>_*>
             )0x0) {
          LOCK();
          *(int *)local_a0.variableAxisValues.d.d.ptr =
               *(int *)local_a0.variableAxisValues.d.d.ptr + 1;
          UNLOCK();
        }
        local_a0.pointSize = (pQVar4->fontDef).pointSize;
        local_a0.pixelSize = (pQVar4->fontDef).pixelSize;
        local_a0._96_8_ = *(ulong *)&(pQVar4->fontDef).field_0x60 | 0x8000;
        pQVar4 = QFontDatabasePrivate::findFont(&local_a0,script,true);
        if (pQVar4 != (QFontEngine *)0x0) {
          if (0x1900000000000 < (local_a0._96_8_ & 0x3ff0000000000)) {
            *(ulong *)&(pQVar4->fontDef).field_0x60 =
                 *(ulong *)&(pQVar4->fontDef).field_0x60 & 0xfffc00ffffffffff |
                 local_a0._96_8_ & 0x3ff0000000000;
          }
          pQVar8 = pQVar4;
          if ((local_a0._96_8_ & 0x30000000) != 0) {
            *(ulong *)&(pQVar4->fontDef).field_0x60 =
                 *(ulong *)&(pQVar4->fontDef).field_0x60 & 0xffffffffcfffffff |
                 local_a0._96_8_ & 0x30000000;
          }
        }
        QtPrivate::
        QExplicitlySharedDataPointerV2<QMapData<std::map<QFont::Tag,_float,_std::less<QFont::Tag>,_std::allocator<std::pair<const_QFont::Tag,_float>_>_>_>_>
        ::~QExplicitlySharedDataPointerV2(&local_a0.variableAxisValues.d);
        QArrayDataPointer<QString>::~QArrayDataPointer(&local_a0.fallBackFamilies.d);
        if (&(local_a0.styleName.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_a0.styleName.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_a0.styleName.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
               _M_i + -1;
          UNLOCK();
          if (((local_a0.styleName.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
              _M_i == 0) {
            QArrayData::deallocate(&(local_a0.styleName.d.d)->super_QArrayData,2,0x10);
          }
        }
        QArrayDataPointer<QString>::~QArrayDataPointer((QArrayDataPointer<QString> *)&local_a0);
      }
      if (pQVar8 == (QFontEngine *)0x0) goto LAB_004b49d6;
    }
    pQVar2 = (this->d).d.ptr;
    pQVar4 = pQVar2->fontEngine;
    if (pQVar4 != pQVar8) {
      if (pQVar4 != (QFontEngine *)0x0) {
        LOCK();
        pQVar1 = &pQVar4->ref;
        (pQVar1->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.
        super___atomic_base<int>._M_i =
             (pQVar1->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.
             super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((pQVar1->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.
             super___atomic_base<int>._M_i == 0) && (pQVar2->fontEngine != (QFontEngine *)0x0)) {
          (*pQVar2->fontEngine->_vptr_QFontEngine[1])();
        }
      }
      pQVar2->fontEngine = pQVar8;
      LOCK();
      (pQVar8->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i =
           (pQVar8->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
           super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    HVar3 = QFont::hintingPreference(font);
    ((this->d).d.ptr)->hintingPreference = HVar3;
  }
LAB_004b49d6:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return (QExplicitlySharedDataPointer<QRawFontPrivate>)
         (QExplicitlySharedDataPointer<QRawFontPrivate>)this;
}

Assistant:

QRawFont QRawFont::fromFont(const QFont &font, QFontDatabase::WritingSystem writingSystem)
{
    QRawFont rawFont;
    const QFontPrivate *font_d = QFontPrivate::get(font);
    int script = qt_script_for_writing_system(writingSystem);
    QFontEngine *fe = font_d->engineForScript(script);

    if (fe != nullptr && fe->type() == QFontEngine::Multi) {
        QFontEngineMulti *multiEngine = static_cast<QFontEngineMulti *>(fe);
        fe = multiEngine->engine(0);

        if (script > QChar::Script_Latin) {
            // keep in sync with QFontEngineMulti::loadEngine()
            QFontDef request(multiEngine->fontDef);
            request.styleStrategy |= QFont::NoFontMerging;

            if (QFontEngine *engine = QFontDatabasePrivate::findFont(request, script, true)) {
                if (request.weight > QFont::Normal)
                    engine->fontDef.weight = request.weight;
                if (request.style > QFont::StyleNormal)
                    engine->fontDef.style = request.style;
                fe = engine;
            }
        }
        Q_ASSERT(fe);
    }

    if (fe != nullptr) {
        rawFont.d.data()->setFontEngine(fe);
        rawFont.d.data()->hintingPreference = font.hintingPreference();
    }
    return rawFont;
}